

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch.cc
# Opt level: O1

void __thiscall Patch::delete_root(Patch *this)

{
  Node *root;
  Text *pTVar1;
  uint32_t uVar2;
  Patch *node_to_delete;
  Node *left;
  Node *pivot;
  Node *root_parent;
  
  root = this->root;
  root_parent = (Node *)0x0;
  do {
    pivot = root->left;
    if (pivot == (Node *)0x0) {
      pivot = root->right;
      if (pivot == (Node *)0x0) {
        node_to_delete = this;
        if (root_parent != (Node *)0x0) {
          node_to_delete = (Patch *)(&root_parent->left + (root_parent->left != root));
        }
        delete_node(this,&node_to_delete->root);
        return;
      }
      rotate_node_left(this,pivot,root,root_parent);
    }
    else {
      rotate_node_right(this,pivot,root,root_parent);
    }
    pTVar1 = (root->old_text)._M_t.super___uniq_ptr_impl<Text,_std::default_delete<Text>_>._M_t.
             super__Tuple_impl<0UL,_Text_*,_std::default_delete<Text>_>.
             super__Head_base<0UL,_Text_*,_false>._M_head_impl;
    if (pTVar1 == (Text *)0x0) {
      uVar2 = root->old_text_size_;
    }
    else {
      uVar2 = Text::size(pTVar1);
    }
    pivot->old_subtree_text_size = pivot->old_subtree_text_size - uVar2;
    pTVar1 = (root->new_text)._M_t.super___uniq_ptr_impl<Text,_std::default_delete<Text>_>._M_t.
             super__Tuple_impl<0UL,_Text_*,_std::default_delete<Text>_>.
             super__Head_base<0UL,_Text_*,_false>._M_head_impl;
    if (pTVar1 == (Text *)0x0) {
      uVar2 = 0;
    }
    else {
      uVar2 = Text::size(pTVar1);
    }
    pivot->new_subtree_text_size = pivot->new_subtree_text_size - uVar2;
    root_parent = pivot;
  } while( true );
}

Assistant:

void Patch::delete_root() {
  Node *node = root, *parent = nullptr;
  while (true) {
    if (node->left) {
      Node *left = node->left;
      rotate_node_right(node->left, node, parent);
      parent = left;
    } else if (node->right) {
      Node *right = node->right;
      rotate_node_left(node->right, node, parent);
      parent = right;
    } else if (parent) {
      if (parent->left == node) {
        delete_node(&parent->left);
        break;
      } else {
        delete_node(&parent->right);
        break;
      }
    } else {
      delete_node(&root);
      break;
    }

    parent->old_subtree_text_size -= node->old_text_size();
    parent->new_subtree_text_size -= node->new_text_size();
  }
}